

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  void *in_RSI;
  unixFile *in_RDI;
  int nCopy;
  int got;
  unixFile *pFile;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  void *local_18;
  int local_4;
  
  iVar2 = -0x55555556;
  local_18 = in_RSI;
  if (in_RCX < in_RDI->mmapSize) {
    if (in_RCX + in_EDX <= in_RDI->mmapSize) {
      memcpy(in_RSI,(void *)((long)in_RDI->pMapRegion + in_RCX),(long)in_EDX);
      return 0;
    }
    iVar1 = (int)in_RDI->mmapSize - (int)in_RCX;
    memcpy(in_RSI,(void *)((long)in_RDI->pMapRegion + in_RCX),(long)iVar1);
    local_18 = (void *)((long)in_RSI + (long)iVar1);
    in_EDX = in_EDX - iVar1;
    in_RCX = iVar1 + in_RCX;
  }
  iVar2 = seekAndRead((unixFile *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_RDI,iVar2);
  if (iVar2 == in_EDX) {
    local_4 = 0;
  }
  else if (iVar2 < 0) {
    if ((in_RDI->lastErrno - 5U < 2) || (in_RDI->lastErrno == 0x22)) {
      local_4 = 0x210a;
    }
    else {
      local_4 = 0x10a;
    }
  }
  else {
    storeLastErrno(in_RDI,0);
    memset((void *)((long)local_18 + (long)iVar2),0,(long)(in_EDX - iVar2));
    local_4 = 0x20a;
  }
  return local_4;
}

Assistant:

static int unixRead(
  sqlite3_file *id,
  void *pBuf,
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, super-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transferring
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* pFile->lastErrno has been set by seekAndRead().
    ** Usually we return SQLITE_IOERR_READ here, though for some
    ** kinds of errors we return SQLITE_IOERR_CORRUPTFS.  The
    ** SQLITE_IOERR_CORRUPTFS will be converted into SQLITE_CORRUPT
    ** prior to returning to the application by the sqlite3ApiExit()
    ** routine.
    */
    switch( pFile->lastErrno ){
      case ERANGE:
      case EIO:
#ifdef ENXIO
      case ENXIO:
#endif
#ifdef EDEVERR
      case EDEVERR:
#endif
        return SQLITE_IOERR_CORRUPTFS;
    }
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}